

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution.hpp
# Opt level: O2

void __thiscall diy::Master::ProcessBlock::operator()(ProcessBlock *this)

{
  int iVar1;
  pointer puVar2;
  _Head_base<0UL,_diy::Master::BaseCommand_*,_false> _Var3;
  bool bVar4;
  size_type sVar5;
  reference piVar6;
  mapped_type *this_00;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_> *cmd;
  pointer puVar7;
  Master *pMVar8;
  void *pvVar9;
  int i;
  int gid;
  vector<int,_std::allocator<int>_> local;
  int local_100;
  int local_fc;
  _Vector_base<int,_std::allocator<int>_> local_f8;
  mapped_type *local_d8;
  undefined1 local_d0 [160];
  
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  while( true ) {
    critical_resource<int,_tthread::fast_mutex>::access
              ((critical_resource<int,_tthread::fast_mutex> *)local_d0,(char *)this->idx,(int)in_RDX
              );
    iVar1 = *(int *)local_d0._0_8_;
    *(int *)local_d0._0_8_ = iVar1 + 1;
    Catch::clara::std::unique_lock<tthread::fast_mutex>::~unique_lock
              ((unique_lock<tthread::fast_mutex> *)(local_d0 + 8));
    sVar5 = Catch::clara::std::deque<int,_std::allocator<int>_>::size(this->blocks);
    if (sVar5 <= (ulong)(long)iVar1) break;
    piVar6 = Catch::clara::std::_Deque_iterator<int,_int_&,_int_*>::operator[]
                       (&(this->blocks->super__Deque_base<int,_std::allocator<int>_>)._M_impl.
                         super__Deque_impl_data._M_start,(long)iVar1);
    local_100 = *piVar6;
    pMVar8 = this->master;
    local_fc = (pMVar8->gids_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[local_100];
    if ((pMVar8->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[local_100] != (void *)0x0) {
      if ((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
          (long)local_f8._M_impl.super__Vector_impl_data._M_start >> 2 == (long)this->local_limit) {
        unload(pMVar8,(vector<int,_std::allocator<int>_> *)&local_f8);
      }
      Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)&local_f8,&local_100);
    }
    bVar4 = all_skip(this,local_100);
    local_d8 = Catch::clara::std::
               map<int,_diy::Master::IncomingRound,_std::less<int>,_std::allocator<std::pair<const_int,_diy::Master::IncomingRound>_>_>
               ::operator[](&this->master->incoming_,&this->master->exchange_round_);
    pMVar8 = this->master;
    in_RDX = extraout_RDX;
    if ((pMVar8->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_start[local_100] == (void *)0x0) {
      if (bVar4) {
        load_queues(pMVar8,local_100);
        in_RDX = extraout_RDX_00;
      }
      else {
        if ((long)local_f8._M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8._M_impl.super__Vector_impl_data._M_start >> 2 == (long)this->local_limit)
        {
          unload(pMVar8,(vector<int,_std::allocator<int>_> *)&local_f8);
          pMVar8 = this->master;
        }
        Master::load(pMVar8,local_100);
        Catch::clara::std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)&local_f8,&local_100);
        in_RDX = extraout_RDX_01;
      }
    }
    puVar2 = (this->master->commands_).
             super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar7 = (this->master->commands_).
                  super__Vector_base<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>,_std::allocator<std::unique_ptr<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar2; puVar7 = puVar7 + 1)
    {
      if (bVar4) {
        pvVar9 = (void *)0x0;
      }
      else {
        pvVar9 = (this->master->blocks_).elements_.
                 super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data
                 ._M_start[local_100];
      }
      _Var3._M_head_impl =
           (puVar7->_M_t).
           super___uniq_ptr_impl<diy::Master::BaseCommand,_std::default_delete<diy::Master::BaseCommand>_>
           ._M_t.
           super__Tuple_impl<0UL,_diy::Master::BaseCommand_*,_std::default_delete<diy::Master::BaseCommand>_>
           .super__Head_base<0UL,_diy::Master::BaseCommand_*,_false>._M_head_impl;
      proxy((ProxyWithLink *)local_d0,this->master,local_100,(IExchangeInfo *)0x0);
      (*(_Var3._M_head_impl)->_vptr_BaseCommand[2])
                (_Var3._M_head_impl,pvVar9,(ProxyWithLink *)local_d0);
      Proxy::~Proxy((Proxy *)local_d0);
      this_00 = Catch::clara::std::
                map<int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>,_std::less<int>,_std::allocator<std::pair<const_int,_diy::concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>_>_>_>
                ::operator[](&local_d8->map,&local_fc);
      concurrent_map<int,_diy::critical_resource<std::deque<diy::Master::QueueRecord,_std::allocator<diy::Master::QueueRecord>_>,_tthread::fast_mutex>_>
      ::clear(this_00);
      in_RDX = extraout_RDX_02;
    }
    if (bVar4) {
      if ((this->master->blocks_).elements_.super__Vector_base<void_*,_std::allocator<void_*>_>.
          _M_impl.super__Vector_impl_data._M_start[local_100] == (void *)0x0) {
        unload_queues(this->master,local_100);
        in_RDX = extraout_RDX_03;
      }
    }
  }
  Catch::clara::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f8);
  return;
}

Assistant:

void    operator()()
  {
    master.log->debug("Processing with thread: {}",  this_thread::get_id());

    std::vector<int>      local;
    do
    {
      int cur = (*idx.access())++;

      if ((size_t)cur >= blocks.size())
          return;

      int i   = blocks[cur];
      int gid = master.gid(i);
      stats::Annotation::Guard g( stats::Annotation("diy.block").set(gid) );

      if (master.block(i))
      {
          if (local.size() == (size_t)local_limit)
              master.unload(local);
          local.push_back(i);
      }

      master.log->debug("Processing block: {}", gid);

      bool skip = all_skip(i);

      IncomingQueuesMap &current_incoming = master.incoming_[master.exchange_round_].map;

      if (master.block(i) == 0)             // block unloaded
      {
          if (skip)
              master.load_queues(i);        // even though we are skipping the block, the queues might be necessary
          else
          {
              if (local.size() == (size_t)local_limit)      // reached the local limit
                  master.unload(local);

              master.load(i);
              local.push_back(i);
          }
      }

      for (auto& cmd : master.commands_)
      {
          cmd->execute(skip ? 0 : master.block(i), master.proxy(i));

          // no longer need them, so get rid of them
          current_incoming[gid].clear();
      }

      if (skip && master.block(i) == 0)
          master.unload_queues(i);    // even though we are skipping the block, the queues might be necessary
    } while(true);
  }